

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O0

void __thiscall OpenMD::Velocitizer::randomizeChargeVelocity(Velocitizer *this,RealType temperature)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Globals *this_00;
  size_type sVar5;
  reference ppAVar6;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar7;
  RealType RVar8;
  FluctuatingChargeAdapter fqa_1;
  AtomType *atomType_1;
  Atom *atom_1;
  size_t i;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atomList;
  RigidBody *rigidbody;
  FluctuatingChargeAdapter fqa;
  AtomType *atomType;
  Atom *atom;
  int dfActual;
  int dfRaw;
  int nConstrain;
  Globals *simParams;
  normal_distribution<double> normalDistribution;
  FluctuatingChargeConstraints *fqConstraints;
  FluctuatingChargeParameters *fqParams;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator ioi;
  MoleculeIterator mi;
  RealType wbar;
  RealType kebar;
  RealType aw2;
  SimInfo *in_stack_fffffffffffffe88;
  FluctuatingChargeConstraints *in_stack_fffffffffffffe90;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *in_stack_fffffffffffffe98;
  StuntDouble *in_stack_fffffffffffffea0;
  iterator *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  FluctuatingChargeConstraints *in_stack_fffffffffffffeb8;
  FluctuatingChargeAdapter local_108;
  AtomType *local_100;
  SimInfo *local_f8;
  ulong local_f0;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_d0;
  FluctuatingChargeConstraints *local_b8;
  FluctuatingChargeAdapter local_b0;
  AtomType *local_a8;
  FluctuatingChargeConstraints *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff7f;
  FluctuatingChargeConstraints *local_48;
  Molecule *local_40;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_38;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_30;
  FluctuatingChargeConstraints *local_28;
  double local_20;
  double local_18;
  double local_10;
  
  local_10 = in_XMM0_Qa;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_30);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_38);
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)in_stack_fffffffffffffea0,
             (result_type_conflict)in_stack_fffffffffffffe98,
             (result_type_conflict)in_stack_fffffffffffffe90);
  this_00 = SimInfo::getSimParams(*(SimInfo **)(in_RDI + 8));
  Globals::getFluctuatingChargeParameters(this_00);
  operator_new(0x88);
  FluctuatingChargeConstraints::FluctuatingChargeConstraints
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  FluctuatingChargeParameters::getConstrainRegions((FluctuatingChargeParameters *)0x39ba4e);
  FluctuatingChargeConstraints::setConstrainRegions
            ((FluctuatingChargeConstraints *)this_00,(bool)in_stack_ffffffffffffff7f);
  iVar3 = FluctuatingChargeConstraints::getNumberOfFlucQConstraints(in_stack_fffffffffffffeb8);
  iVar4 = FluctuatingChargeConstraints::getNumberOfFlucQAtoms(in_stack_fffffffffffffeb8);
  local_20 = ((double)iVar4 * 0.0019872156 * local_10) / (double)((iVar4 - iVar3) * 2);
  local_40 = SimInfo::beginMolecule
                       ((SimInfo *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                        (MoleculeIterator *)in_stack_fffffffffffffea8);
  while (local_40 != (Molecule *)0x0) {
    local_48 = (FluctuatingChargeConstraints *)
               Molecule::beginIntegrableObject
                         ((Molecule *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                          in_stack_fffffffffffffea8);
    while (local_48 != (FluctuatingChargeConstraints *)0x0) {
      bVar2 = StuntDouble::isAtom((StuntDouble *)local_48);
      if (bVar2) {
        in_stack_ffffffffffffff60 = local_48;
        local_a8 = Atom::getAtomType((Atom *)local_48);
        FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_b0,local_a8);
        bVar2 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x39bb8b);
        if (bVar2) {
          dVar7 = local_20 * 2.0;
          RVar8 = Atom::getChargeMass((Atom *)in_stack_ffffffffffffff60);
          local_18 = dVar7 / RVar8;
          local_28 = (FluctuatingChargeConstraints *)sqrt(local_18);
          std::
          __shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffffe90);
          std::normal_distribution<double>::operator()
                    ((normal_distribution<double> *)in_stack_fffffffffffffe90,
                     (RandNumGen *)in_stack_fffffffffffffe88);
          StuntDouble::setFlucQVel(in_stack_fffffffffffffea0,(RealType)in_stack_fffffffffffffe98);
        }
      }
      bVar2 = StuntDouble::isRigidBody((StuntDouble *)local_48);
      if (bVar2) {
        local_b8 = local_48;
        std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
                  ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)0x39bc95);
        RigidBody::getAtoms((RigidBody *)in_stack_fffffffffffffe88);
        std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator=
                  ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                   in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
                  ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                   in_stack_fffffffffffffea0);
        for (local_f0 = 0; uVar1 = local_f0,
            sVar5 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size(&local_d0),
            uVar1 < sVar5; local_f0 = local_f0 + 1) {
          ppAVar6 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                              (&local_d0,local_f0);
          local_f8 = (SimInfo *)*ppAVar6;
          local_100 = Atom::getAtomType((Atom *)local_f8);
          FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_108,local_100);
          in_stack_fffffffffffffeb7 =
               FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x39bd5e);
          if ((bool)in_stack_fffffffffffffeb7) {
            in_stack_fffffffffffffea0 = (StuntDouble *)(local_20 + local_20);
            in_stack_fffffffffffffea8 = (iterator *)Atom::getChargeMass((Atom *)local_f8);
            local_18 = (double)in_stack_fffffffffffffea0 / (double)in_stack_fffffffffffffea8;
            in_stack_fffffffffffffe90 = (FluctuatingChargeConstraints *)sqrt(local_18);
            in_stack_fffffffffffffe88 = local_f8;
            local_28 = in_stack_fffffffffffffe90;
            std::
            __shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_stack_fffffffffffffe90);
            in_stack_fffffffffffffe98 =
                 (vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                 std::normal_distribution<double>::operator()
                           ((normal_distribution<double> *)in_stack_fffffffffffffe90,
                            (RandNumGen *)in_stack_fffffffffffffe88);
            StuntDouble::setFlucQVel(in_stack_fffffffffffffea0,(RealType)in_stack_fffffffffffffe98);
          }
        }
        std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
                  ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                   in_stack_fffffffffffffea0);
      }
      local_48 = (FluctuatingChargeConstraints *)
                 Molecule::nextIntegrableObject
                           ((Molecule *)
                            CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                            in_stack_fffffffffffffea8);
    }
    local_40 = SimInfo::nextMolecule
                         ((SimInfo *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                          (MoleculeIterator *)in_stack_fffffffffffffea8);
  }
  FluctuatingChargeConstraints::applyConstraintsOnChargeVelocities(in_stack_ffffffffffffff60);
  return;
}

Assistant:

void Velocitizer::randomizeChargeVelocity(RealType temperature) {
    RealType aw2;
    RealType kebar;
    RealType wbar;

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;
    FluctuatingChargeParameters* fqParams;
    FluctuatingChargeConstraints* fqConstraints;

    std::normal_distribution<RealType> normalDistribution {0.0, 1.0};

    Globals* simParams = info_->getSimParams();
    fqParams           = simParams->getFluctuatingChargeParameters();

    fqConstraints = new FluctuatingChargeConstraints(info_);
    fqConstraints->setConstrainRegions(fqParams->getConstrainRegions());

    int nConstrain =
        fqConstraints
            ->getNumberOfFlucQConstraints();  // no of constraints in charge
    int dfRaw = fqConstraints->getNumberOfFlucQAtoms();  // no of FlucQ freedom
    int dfActual = dfRaw - nConstrain;
    kebar        = dfRaw * Constants::kb * temperature / (2 * dfActual);

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        if (sd->isAtom()) {
          Atom* atom                   = static_cast<Atom*>(sd);
          AtomType* atomType           = atom->getAtomType();
          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
          if (fqa.isFluctuatingCharge()) {
            // uses equipartition theory to solve for vbar in angstrom/fs

            aw2  = 2.0 * kebar / atom->getChargeMass();
            wbar = sqrt(aw2);

            // picks random velocities from a gaussian distribution
            // centered on vbar
            atom->setFlucQVel(wbar * normalDistribution(*randNumGen_));
          }
        }

        // randomization of the charge velocities for atoms in the rigidbody

        if (sd->isRigidBody()) {
          RigidBody* rigidbody = static_cast<RigidBody*>(sd);
          vector<Atom*> atomList;
          atomList = rigidbody->getAtoms();

          for (size_t i = 0; i < atomList.size(); ++i) {
            Atom* atom                   = atomList[i];
            AtomType* atomType           = atom->getAtomType();
            FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
            if (fqa.isFluctuatingCharge()) {
              // uses equipartition theory to solve for vbar in angstrom/fs
              aw2  = 2.0 * kebar / atom->getChargeMass();
              wbar = sqrt(aw2);
              // picks random velocities from a gaussian distribution
              // centered on vbar
              atom->setFlucQVel(wbar * normalDistribution(*randNumGen_));
            }
          }
        }
      }
    }
    fqConstraints->applyConstraintsOnChargeVelocities();
  }